

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

float ImStb::STB_TEXTEDIT_GETWIDTH(ImGuiInputTextState *obj,int line_start_idx,int char_idx)

{
  ushort uVar1;
  ImFont *pIVar2;
  float *pfVar3;
  uint uVar4;
  
  uVar4 = line_start_idx + char_idx;
  if ((-1 < (int)uVar4) && ((int)uVar4 < (obj->TextW).Size)) {
    uVar1 = (obj->TextW).Data[uVar4];
    if (uVar1 == 10) {
      return -1.0;
    }
    pIVar2 = GImGui->Font;
    pfVar3 = &pIVar2->FallbackAdvanceX;
    if ((int)(uint)uVar1 < (pIVar2->IndexAdvanceX).Size) {
      pfVar3 = (float *)((ulong)((uint)uVar1 * 4) + (long)(pIVar2->IndexAdvanceX).Data);
    }
    return (GImGui->FontSize / pIVar2->FontSize) * *pfVar3;
  }
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                ,0x74f,"T &ImVector<unsigned short>::operator[](int) [T = unsigned short]");
}

Assistant:

inline T&           operator[](int i)                   { IM_ASSERT(i >= 0 && i < Size); return Data[i]; }